

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O0

void __thiscall MetaSim::Simulation::clearEventQueue(Simulation *this)

{
  bool bVar1;
  Event *in_RDI;
  Event *temp;
  Tick local_18;
  Event *local_10;
  
  while (local_10 = Event::getFirst(), local_10 != (Event *)0x0) {
    Event::drop(in_RDI);
    bVar1 = Event::isDisposable(local_10);
    if ((bVar1) && (local_10 != (Event *)0x0)) {
      (*local_10->_vptr_Event[1])();
    }
  }
  Tick::Tick(&local_18,0);
  (in_RDI->_lastTime).v = local_18.v;
  return;
}

Assistant:

void Simulation::clearEventQueue()
    {
        Event *temp;
        while ((temp = Event::getFirst()) != NULL) {
            temp->drop();
            if (temp->isDisposable()) // if it has to be deleted...
                delete temp;                 
        }
        globTime = 0;
    }